

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O0

t_object * __thiscall xemmai::t_script::f_slot(t_script *this,t_object *a_p)

{
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  atomic<xemmai::t_object_*> *this_02;
  __pointer_type ptVar1;
  t_object *ptVar2;
  long *in_FS_OFFSET;
  value_type *p;
  t_object *a_p_local;
  t_script *this_local;
  __pointer_type p_1;
  
  std::mutex::lock(&this->v_mutex);
  this_02 = &std::deque<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>::emplace_back<>
                       (&this->v_slots)->v_p;
  std::mutex::unlock(&this->v_mutex);
  if ((t_object *)0x4 < a_p) {
    this_00 = *(t_queue<128UL> **)(*in_FS_OFFSET + -0x68);
    *this_00->v_head = a_p;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  ptVar1 = std::atomic<xemmai::t_object_*>::exchange(this_02,a_p,relaxed);
  if ((__pointer_type)0x4 < ptVar1) {
    this_01 = *(t_queue<256UL> **)(*in_FS_OFFSET + -0x70);
    *this_01->v_head = ptVar1;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
    }
    else {
      this_01->v_head = this_01->v_head + 1;
    }
  }
  ptVar2 = t_slot::operator_cast_to_t_object_((t_slot *)this_02);
  return ptVar2;
}

Assistant:

t_object* f_slot(t_object* a_p)
	{
		v_mutex.lock();
		auto& p = v_slots.emplace_back();
		v_mutex.unlock();
		return p = a_p;
	}